

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe_partial_usingDict
              (char *source,char *dest,int compressedSize,int targetOutputSize,int dstCapacity,
              char *dictStart,int dictSize)

{
  byte *pbVar1;
  char *pcVar2;
  byte bVar3;
  ushort uVar4;
  undefined8 uVar5;
  ushort uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  char cVar11;
  size_t dictSize_00;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  ushort *__src;
  int iVar16;
  BYTE *s;
  ushort *puVar17;
  BYTE *s_1;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  char *pcVar21;
  size_t sVar22;
  long lStackY_a0;
  int local_60;
  
  if (dictSize == 0) {
    iVar8 = LZ4_decompress_safe_partial(source,dest,compressedSize,targetOutputSize,dstCapacity);
    return iVar8;
  }
  dictSize_00 = (size_t)dictSize;
  if (dictStart + dictSize_00 != dest) {
    iVar8 = LZ4_decompress_safe_partial_forceExtDict
                      (source,dest,compressedSize,targetOutputSize,dstCapacity,dictStart,dictSize_00
                      );
    return iVar8;
  }
  uVar10 = (ulong)(uint)dstCapacity;
  if (targetOutputSize < dstCapacity) {
    uVar10 = (ulong)(uint)targetOutputSize;
  }
  iVar8 = (int)uVar10;
  iVar16 = (int)dest;
  if (dictSize < 0xffff) {
    if (iVar8 < 0 || source == (char *)0x0) {
      return -1;
    }
    if (iVar8 != 0) {
      if (compressedSize == 0) {
        return -1;
      }
      pcVar15 = dest + -dictSize_00;
      pbVar1 = (byte *)(source + compressedSize);
      pcVar2 = dest + uVar10;
      pcVar21 = dest + (uVar10 - 0x20);
      puVar17 = (ushort *)source;
      while( true ) {
        __src = (ushort *)((long)puVar17 + 1);
        bVar3 = (byte)*puVar17;
        uVar10 = (ulong)(uint)(bVar3 >> 4);
        if (bVar3 >> 4 == 0xf) break;
        if ((source + (long)compressedSize + -0x10 <= __src) || (pcVar21 < dest)) goto LAB_00119e0c;
        uVar5 = *(undefined8 *)((long)puVar17 + 9);
        *(undefined8 *)dest = *(undefined8 *)__src;
        *(undefined8 *)(dest + 8) = uVar5;
        pcVar13 = dest + uVar10;
        uVar20 = (ulong)(bVar3 & 0xf);
        puVar17 = (ushort *)(uVar10 + (long)__src);
        __src = puVar17 + 1;
        uVar4 = *puVar17;
        uVar7 = (uint)uVar4;
        pcVar14 = pcVar13 + -(ulong)uVar4;
        if ((uVar20 == 0xf) || ((uVar4 < 8 || (pcVar14 < pcVar15)))) {
LAB_00119f30:
          if ((int)uVar20 == 0xf) {
            lStackY_a0 = 0;
            puVar17 = __src;
            do {
              __src = (ushort *)((long)puVar17 + 1);
              if (pbVar1 + -4 < __src) {
                lStackY_a0 = -1;
                break;
              }
              uVar4 = *puVar17;
              lStackY_a0 = lStackY_a0 + (ulong)(byte)uVar4;
              puVar17 = __src;
            } while ((ulong)(byte)uVar4 == 0xff);
            uVar20 = lStackY_a0 + 0xf;
            if ((lStackY_a0 == -1) || (CARRY8((ulong)pcVar13,uVar20))) goto LAB_0011a098;
          }
          if (pcVar14 < pcVar15) goto LAB_0011a098;
          uVar20 = uVar20 + 4;
          dest = pcVar13 + uVar20;
          puVar17 = __src;
          if (pcVar2 + -0xc < dest) {
            uVar10 = (long)pcVar2 - (long)pcVar13;
            if (uVar20 < (ulong)((long)pcVar2 - (long)pcVar13)) {
              uVar10 = uVar20;
            }
            dest = pcVar13 + uVar10;
            if (pcVar13 < pcVar14 + uVar10) {
              if (0 < (long)uVar10) {
                do {
                  cVar11 = *pcVar14;
                  pcVar14 = pcVar14 + 1;
                  *pcVar13 = cVar11;
                  pcVar13 = pcVar13 + 1;
                } while (pcVar13 < dest);
              }
            }
            else {
              memcpy(pcVar13,pcVar14,uVar10);
            }
            if (dest == pcVar2) {
LAB_0011a0e0:
              return (int)dest - iVar16;
            }
          }
          else {
            if (uVar7 < 8) {
              pcVar13[0] = '\0';
              pcVar13[1] = '\0';
              pcVar13[2] = '\0';
              pcVar13[3] = '\0';
              *pcVar13 = *pcVar14;
              pcVar13[1] = pcVar14[1];
              pcVar13[2] = pcVar14[2];
              pcVar13[3] = pcVar14[3];
              uVar10 = (ulong)*(uint *)((long)inc32table + (ulong)(uVar7 << 2));
              *(undefined4 *)(pcVar13 + 4) = *(undefined4 *)(pcVar14 + uVar10);
              pcVar14 = pcVar14 + (uVar10 - (long)*(int *)((long)dec64table + (ulong)(uVar7 << 2)));
            }
            else {
              *(undefined8 *)pcVar13 = *(undefined8 *)pcVar14;
              pcVar14 = pcVar14 + 8;
            }
            *(undefined8 *)(pcVar13 + 8) = *(undefined8 *)pcVar14;
            if (0x10 < uVar20) {
              pcVar13 = pcVar13 + 0x10;
              do {
                pcVar14 = pcVar14 + 8;
                *(undefined8 *)pcVar13 = *(undefined8 *)pcVar14;
                pcVar13 = pcVar13 + 8;
              } while (pcVar13 < dest);
            }
          }
        }
        else {
          *(undefined8 *)pcVar13 = *(undefined8 *)pcVar14;
          *(undefined8 *)(pcVar13 + 8) = *(undefined8 *)(pcVar14 + 8);
          *(undefined2 *)(pcVar13 + 0x10) = *(undefined2 *)(pcVar14 + 0x10);
          dest = pcVar13 + uVar20 + 4;
          puVar17 = __src;
        }
      }
      lStackY_a0 = -1;
      if (__src < pbVar1 + -0xf) {
        lStackY_a0 = 0;
        puVar17 = puVar17 + 1;
        do {
          __src = puVar17;
          if (pbVar1 + -0xf < __src) {
            lStackY_a0 = -1;
            break;
          }
          lStackY_a0 = lStackY_a0 + (ulong)*(byte *)((long)__src + -1);
          puVar17 = (ushort *)((long)__src + 1);
        } while ((ulong)*(byte *)((long)__src + -1) == 0xff);
      }
      cVar11 = '\x05';
      uVar10 = 0xf;
      if ((lStackY_a0 != -1) && (uVar10 = lStackY_a0 + 0xf, !CARRY8((ulong)dest,uVar10))) {
        cVar11 = CARRY8((ulong)__src,uVar10) * '\x05';
      }
      if (cVar11 != '\0') goto LAB_0011a093;
LAB_00119e0c:
      pcVar13 = dest + uVar10;
      if ((pcVar2 + -0xc < pcVar13) ||
         (puVar17 = (ushort *)(uVar10 + (long)__src), pbVar1 + -8 < puVar17)) {
        if (pbVar1 < (byte *)(uVar10 + (long)__src)) {
          pcVar13 = dest + ((long)pbVar1 - (long)__src);
          uVar10 = (long)pbVar1 - (long)__src;
        }
        sVar22 = (long)pcVar2 - (long)dest;
        if (pcVar13 <= pcVar2) {
          sVar22 = uVar10;
        }
        memmove(dest,__src,sVar22);
        dest = dest + sVar22;
        if ((pcVar2 <= pcVar13) ||
           (puVar17 = (ushort *)((long)__src + sVar22), pcVar13 = dest, pbVar1 + -2 <= puVar17))
        goto LAB_0011a0e0;
      }
      else {
        do {
          *(undefined8 *)dest = *(undefined8 *)__src;
          dest = dest + 8;
          __src = __src + 4;
        } while (dest < pcVar13);
      }
      uVar7 = (uint)*puVar17;
      __src = puVar17 + 1;
      pcVar14 = pcVar13 + -(ulong)*puVar17;
      uVar20 = (ulong)(bVar3 & 0xf);
      goto LAB_00119f30;
    }
  }
  else {
    if (iVar8 < 0 || source == (char *)0x0) {
      return -1;
    }
    if (iVar8 != 0) {
      if (compressedSize == 0) {
        return -1;
      }
      pbVar1 = (byte *)(source + compressedSize);
      pcVar2 = dest + uVar10;
      uVar20 = 0;
      puVar17 = (ushort *)source;
LAB_001199f5:
      do {
        pcVar21 = dest + uVar20;
        __src = (ushort *)((long)puVar17 + 1);
        bVar3 = (byte)*puVar17;
        uVar9 = (ulong)(uint)(bVar3 >> 4);
        if (bVar3 >> 4 == 0xf) {
          lStackY_a0 = -1;
          if (__src < pbVar1 + -0xf) {
            lStackY_a0 = 0;
            puVar17 = puVar17 + 1;
            do {
              __src = puVar17;
              if (pbVar1 + -0xf < __src) {
                lStackY_a0 = -1;
                break;
              }
              lStackY_a0 = lStackY_a0 + (ulong)*(byte *)((long)__src + -1);
              puVar17 = (ushort *)((long)__src + 1);
            } while ((ulong)*(byte *)((long)__src + -1) == 0xff);
          }
          cVar11 = '\x05';
          uVar9 = 0xf;
          if ((lStackY_a0 != -1) && (uVar9 = lStackY_a0 + 0xf, !CARRY8((ulong)pcVar21,uVar9))) {
            cVar11 = CARRY8((ulong)__src,uVar9) * '\x05';
          }
          if (cVar11 != '\0') {
LAB_0011a093:
            local_60 = (int)__src;
            if (cVar11 == '\x05') {
LAB_0011a098:
              local_60 = (int)source;
              local_60 = ~(uint)__src + local_60;
            }
            return local_60;
          }
LAB_00119a71:
          lVar19 = uVar9 + uVar20;
          pcVar15 = dest + lVar19;
          if ((pcVar2 + -0xc < pcVar15) ||
             (puVar17 = (ushort *)((long)__src + uVar9), pbVar1 + -8 < puVar17)) {
            if (pbVar1 < (byte *)((long)__src + uVar9)) {
              pcVar15 = pcVar21 + ((long)pbVar1 - (long)__src);
              uVar9 = (long)pbVar1 - (long)__src;
            }
            sVar22 = uVar10 - uVar20;
            if (pcVar15 <= pcVar2) {
              sVar22 = uVar9;
            }
            memmove(pcVar21,__src,sVar22);
            lVar19 = uVar20 + sVar22;
            if ((pcVar2 <= pcVar15) ||
               (puVar17 = (ushort *)((long)__src + sVar22), pbVar1 + -2 <= puVar17)) {
              pcVar21 = dest + lVar19;
              goto LAB_0011a0d3;
            }
          }
          else {
            do {
              *(undefined8 *)pcVar21 = *(undefined8 *)__src;
              pcVar21 = pcVar21 + 8;
              __src = __src + 4;
            } while (pcVar21 < pcVar15);
          }
          uVar4 = *puVar17;
          __src = puVar17 + 1;
          lVar12 = lVar19 - (ulong)uVar4;
          uVar18 = (ulong)(bVar3 & 0xf);
        }
        else {
          if ((source + (long)compressedSize + -0x10 <= __src) || (dest + (uVar10 - 0x20) < pcVar21)
             ) goto LAB_00119a71;
          uVar5 = *(undefined8 *)((long)puVar17 + 9);
          *(undefined8 *)pcVar21 = *(undefined8 *)__src;
          *(undefined8 *)(pcVar21 + 8) = uVar5;
          lVar19 = uVar20 + uVar9;
          uVar18 = (ulong)(bVar3 & 0xf);
          puVar17 = (ushort *)((long)__src + uVar9);
          __src = puVar17 + 1;
          uVar4 = *puVar17;
          lVar12 = lVar19 - (ulong)uVar4;
          if (7 < uVar4 && uVar18 != 0xf) {
            *(undefined8 *)(dest + lVar19) = *(undefined8 *)(dest + lVar12);
            *(undefined8 *)(dest + lVar19 + 8) = *(undefined8 *)(dest + lVar12 + 8);
            *(undefined2 *)(dest + lVar19 + 0x10) = *(undefined2 *)(dest + lVar12 + 0x10);
            uVar20 = lVar19 + uVar18 + 4;
            puVar17 = __src;
            goto LAB_001199f5;
          }
        }
        pcVar15 = dest + lVar19;
        if ((int)uVar18 == 0xf) {
          lStackY_a0 = 0;
          puVar17 = __src;
          do {
            __src = (ushort *)((long)puVar17 + 1);
            if (pbVar1 + -4 < __src) {
              lStackY_a0 = -1;
              break;
            }
            uVar6 = *puVar17;
            lStackY_a0 = lStackY_a0 + (ulong)(byte)uVar6;
            puVar17 = __src;
          } while ((ulong)(byte)uVar6 == 0xff);
          uVar18 = lStackY_a0 + 0xf;
          if ((lStackY_a0 == -1) || (CARRY8((ulong)pcVar15,uVar18))) goto LAB_0011a098;
        }
        if (lVar12 < -0x10000) goto LAB_0011a098;
        pcVar13 = dest + lVar12;
        uVar18 = uVar18 + 4;
        uVar20 = lVar19 + uVar18;
        puVar17 = __src;
        if (pcVar2 + -0xc < dest + uVar20) {
          uVar9 = uVar10 - lVar19;
          if (uVar18 < uVar10 - lVar19) {
            uVar9 = uVar18;
          }
          uVar20 = lVar19 + uVar9;
          pcVar21 = dest + uVar20;
          if (pcVar15 < pcVar13 + uVar9) {
            if (0 < (long)uVar9) {
              do {
                cVar11 = *pcVar13;
                pcVar13 = pcVar13 + 1;
                *pcVar15 = cVar11;
                pcVar15 = pcVar15 + 1;
              } while (pcVar15 < pcVar21);
            }
          }
          else {
            memcpy(pcVar15,pcVar13,uVar9);
          }
          if (uVar20 == uVar10) {
LAB_0011a0d3:
            return (int)pcVar21 - iVar16;
          }
        }
        else {
          if (uVar4 < 8) {
            pcVar15[0] = '\0';
            pcVar15[1] = '\0';
            pcVar15[2] = '\0';
            pcVar15[3] = '\0';
            *pcVar15 = *pcVar13;
            pcVar15[1] = pcVar13[1];
            pcVar15[2] = pcVar13[2];
            pcVar15[3] = pcVar13[3];
            uVar7 = inc32table[uVar4];
            *(undefined4 *)(pcVar15 + 4) = *(undefined4 *)(pcVar13 + uVar7);
            pcVar13 = pcVar13 + ((ulong)uVar7 - (long)dec64table[uVar4]);
          }
          else {
            *(undefined8 *)pcVar15 = *(undefined8 *)pcVar13;
            pcVar13 = pcVar13 + 8;
          }
          *(undefined8 *)(pcVar15 + 8) = *(undefined8 *)pcVar13;
          if (0x10 < uVar18) {
            pcVar15 = pcVar15 + 0x10;
            do {
              pcVar13 = pcVar13 + 8;
              *(undefined8 *)pcVar15 = *(undefined8 *)pcVar13;
              pcVar15 = pcVar15 + 8;
            } while (pcVar15 < dest + uVar20);
          }
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

int LZ4_decompress_safe_partial_usingDict(const char* source, char* dest, int compressedSize, int targetOutputSize, int dstCapacity, const char* dictStart, int dictSize)
{
    if (dictSize==0)
        return LZ4_decompress_safe_partial(source, dest, compressedSize, targetOutputSize, dstCapacity);
    if (dictStart+dictSize == dest) {
        if (dictSize >= 64 KB - 1) {
            return LZ4_decompress_safe_partial_withPrefix64k(source, dest, compressedSize, targetOutputSize, dstCapacity);
        }
        assert(dictSize >= 0);
        return LZ4_decompress_safe_partial_withSmallPrefix(source, dest, compressedSize, targetOutputSize, dstCapacity, (size_t)dictSize);
    }
    assert(dictSize >= 0);
    return LZ4_decompress_safe_partial_forceExtDict(source, dest, compressedSize, targetOutputSize, dstCapacity, dictStart, (size_t)dictSize);
}